

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

int AF_A_IceSetTics(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  AActor *thing;
  VMValue *pVVar7;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00602d98;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00602d88;
  thing = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (thing == (AActor *)0x0) goto LAB_00602c64;
    pPVar6 = (thing->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (thing->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar8 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar8;
    bVar9 = pPVar6 == pPVar3;
    if (!bVar9 && !bVar8) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
    uVar5 = (uint)bVar8;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00602d98;
    }
  }
  else {
    if (thing != (AActor *)0x0) goto LAB_00602d88;
LAB_00602c64:
    thing = (AActor *)0x0;
    pVVar7 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_00602d24;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_00602d88:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_00602d98;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar6 = (PClass *)puVar2[1];
        if (pPVar6 == (PClass *)0x0) {
          pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar5,ret);
          puVar2[1] = pPVar6;
        }
        bVar8 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar8) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar8 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00602d98;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_00602d88;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00602d24:
    uVar5 = FRandom::GenRand32(&pr_icesettics);
    thing->tics = (uVar5 & 0x3f) + 0x46;
    iVar4 = P_GetThingFloorType(thing);
    iVar4 = Terrains.Array[iVar4].DamageMOD.Index;
    if (iVar4 == 0x33) {
      iVar4 = thing->tics * 2;
    }
    else {
      if (iVar4 != 0x9f) {
        return 0;
      }
      iVar4 = thing->tics >> 2;
    }
    thing->tics = iVar4;
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_00602d98:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceSetTics)
{
	PARAM_ACTION_PROLOGUE;

	int floor;

	self->tics = 70+(pr_icesettics()&63);
	floor = P_GetThingFloorType (self);
	if (Terrains[floor].DamageMOD == NAME_Fire)
	{
		self->tics >>= 2;
	}
	else if (Terrains[floor].DamageMOD == NAME_Ice)
	{
		self->tics <<= 1;
	}
	return 0;
}